

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableUpdateBorders(ImGuiTable *table)

{
  short sVar1;
  ImGuiTableColumn *pIVar2;
  bool bVar3;
  ImGuiTableInstanceData *pIVar4;
  ImGuiID id;
  ulong uVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  bool held;
  bool hovered;
  ImRect hit_rect;
  bool local_82;
  bool local_81;
  float local_80;
  float local_7c;
  ImRect local_78;
  ImGuiContext *local_68;
  ImGuiTableInstanceData *local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if ((long)table->InstanceCurrent == 0) {
    pIVar4 = &table->InstanceDataFirst;
  }
  else {
    pIVar4 = (table->InstanceDataExtra).Data + (long)table->InstanceCurrent + -1;
  }
  if (0 < table->ColumnsCount) {
    local_68 = GImGui;
    local_58 = ZEXT416((uint)(float)(int)(GImGui->CurrentDpiScale * 4.0));
    fVar7 = (table->OuterRect).Max.y;
    local_7c = (float)table->RowBgColor[(ulong)(table->FreezeRowsCount < 1) * 8 + 0x16] +
               table->AngledHeadersHeight;
    fVar8 = (pIVar4->LastOuterHeight + local_7c) - table->AngledHeadersHeight;
    uVar6 = -(uint)(fVar8 <= fVar7);
    local_48 = ZEXT416(uVar6 & (uint)fVar7 | ~uVar6 & (uint)fVar8);
    local_80 = pIVar4->LastTopHeadersRowHeight + local_7c;
    local_60 = &table->InstanceDataFirst;
    uVar5 = 0;
    do {
      if ((table->EnabledMaskByDisplayOrder[uVar5 >> 5 & 0x7ffffff] >> ((uint)uVar5 & 0x1f) & 1) !=
          0) {
        pIVar2 = (table->Columns).Data;
        sVar1 = (table->DisplayOrderToIndex).Data[uVar5];
        if ((pIVar2[sVar1].Flags & 0x40000020U) == 0) {
          local_78.Max.y = (float)local_48._0_4_;
          if ((((table->Flags & 0x800) == 0) ||
              (local_78.Max.y = local_80, table->IsUsingHeaders != false)) &&
             ((pIVar2[sVar1].IsVisibleX != false || (table->LastResizedColumn == sVar1)))) {
            pIVar4 = local_60;
            if ((long)table->InstanceCurrent != 0) {
              pIVar4 = (table->InstanceDataExtra).Data + (long)table->InstanceCurrent + -1;
            }
            id = (int)sVar1 + pIVar4->TableInstanceID + 1;
            local_78.Min.x = pIVar2[sVar1].MaxX - (float)local_58._0_4_;
            local_78.Max.x = pIVar2[sVar1].MaxX + (float)local_58._0_4_;
            local_78.Min.y = local_7c;
            ItemAdd(&local_78,id,(ImRect *)0x0,2);
            local_81 = false;
            local_82 = false;
            bVar3 = ButtonBehavior(&local_78,id,&local_81,&local_82,0x40910);
            if ((bVar3) && (bVar3 = IsMouseDoubleClicked(0), bVar3)) {
              pIVar2 = (table->Columns).Data;
              if (pIVar2[sVar1].IsEnabled == true) {
                pIVar2[sVar1].CannotSkipItemsQueue = '\x01';
                table->AutoFitSingleColumn = sVar1;
              }
              ClearActiveID();
              local_82 = false;
            }
            if (local_82 == true) {
              if (table->LastResizedColumn == -1) {
                fVar7 = -3.4028235e+38;
                if ((long)table->RightMostEnabledColumn != -1) {
                  fVar7 = (table->Columns).Data[table->RightMostEnabledColumn].MaxX;
                }
                table->ResizeLockMinContentsX2 = fVar7;
              }
              table->ResizedColumn = sVar1;
              table->InstanceInteracted = table->InstanceCurrent;
            }
            if (local_81 == true) {
              if (0.06 < local_68->HoveredIdTimer || local_82 != false) {
LAB_001b2201:
                table->HoveredColumnBorder = sVar1;
                SetMouseCursor(4);
              }
            }
            else if (local_82 != false) goto LAB_001b2201;
          }
        }
      }
      uVar5 = uVar5 + 1;
    } while ((long)uVar5 < (long)table->ColumnsCount);
  }
  return;
}

Assistant:

void ImGui::TableUpdateBorders(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->Flags & ImGuiTableFlags_Resizable);

    // At this point OuterRect height may be zero or under actual final height, so we rely on temporal coherency and
    // use the final height from last frame. Because this is only affecting _interaction_ with columns, it is not
    // really problematic (whereas the actual visual will be displayed in EndTable() and using the current frame height).
    // Actual columns highlight/render will be performed in EndTable() and not be affected.
    ImGuiTableInstanceData* table_instance = TableGetInstanceData(table, table->InstanceCurrent);
    const float hit_half_width = ImTrunc(TABLE_RESIZE_SEPARATOR_HALF_THICKNESS * g.CurrentDpiScale);
    const float hit_y1 = (table->FreezeRowsCount >= 1 ? table->OuterRect.Min.y : table->WorkRect.Min.y) + table->AngledHeadersHeight;
    const float hit_y2_body = ImMax(table->OuterRect.Max.y, hit_y1 + table_instance->LastOuterHeight - table->AngledHeadersHeight);
    const float hit_y2_head = hit_y1 + table_instance->LastTopHeadersRowHeight;

    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        if (!IM_BITARRAY_TESTBIT(table->EnabledMaskByDisplayOrder, order_n))
            continue;

        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->Flags & (ImGuiTableColumnFlags_NoResize | ImGuiTableColumnFlags_NoDirectResize_))
            continue;

        // ImGuiTableFlags_NoBordersInBodyUntilResize will be honored in TableDrawBorders()
        const float border_y2_hit = (table->Flags & ImGuiTableFlags_NoBordersInBody) ? hit_y2_head : hit_y2_body;
        if ((table->Flags & ImGuiTableFlags_NoBordersInBody) && table->IsUsingHeaders == false)
            continue;

        if (!column->IsVisibleX && table->LastResizedColumn != column_n)
            continue;

        ImGuiID column_id = TableGetColumnResizeID(table, column_n, table->InstanceCurrent);
        ImRect hit_rect(column->MaxX - hit_half_width, hit_y1, column->MaxX + hit_half_width, border_y2_hit);
        ItemAdd(hit_rect, column_id, NULL, ImGuiItemFlags_NoNav);
        //GetForegroundDrawList()->AddRect(hit_rect.Min, hit_rect.Max, IM_COL32(255, 0, 0, 100));

        bool hovered = false, held = false;
        bool pressed = ButtonBehavior(hit_rect, column_id, &hovered, &held, ImGuiButtonFlags_FlattenChildren | ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_PressedOnDoubleClick | ImGuiButtonFlags_NoNavFocus);
        if (pressed && IsMouseDoubleClicked(0))
        {
            TableSetColumnWidthAutoSingle(table, column_n);
            ClearActiveID();
            held = false;
        }
        if (held)
        {
            if (table->LastResizedColumn == -1)
                table->ResizeLockMinContentsX2 = table->RightMostEnabledColumn != -1 ? table->Columns[table->RightMostEnabledColumn].MaxX : -FLT_MAX;
            table->ResizedColumn = (ImGuiTableColumnIdx)column_n;
            table->InstanceInteracted = table->InstanceCurrent;
        }
        if ((hovered && g.HoveredIdTimer > TABLE_RESIZE_SEPARATOR_FEEDBACK_TIMER) || held)
        {
            table->HoveredColumnBorder = (ImGuiTableColumnIdx)column_n;
            SetMouseCursor(ImGuiMouseCursor_ResizeEW);
        }
    }
}